

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  TokenType TVar1;
  size_t __n;
  string *psVar2;
  int64 iVar3;
  bool bVar4;
  bool value_00;
  int iVar5;
  LogMessage *other;
  EnumValueDescriptor *value_01;
  char *pcVar6;
  undefined8 *puVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type *psVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  FieldDescriptor *pFVar11;
  byte bVar12;
  _Alloc_hider _Var13;
  float value_02;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  EnumDescriptor *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string value_4;
  int64 int_value;
  int64 value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    int_value = (int64)FieldDescriptor::TypeOnceInit;
    local_90 = (undefined1  [8])field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&int_value,
               (FieldDescriptor **)local_90);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    bVar4 = ConsumeSignedInteger(this,&int_value,0x7fffffff);
    if (!bVar4) {
LAB_002f423b:
      bVar12 = 0;
      goto LAB_002f423d;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt32(reflection,message,field,(uint32)int_value);
    }
    else {
      Reflection::SetInt32(reflection,message,field,(uint32)int_value);
    }
    break;
  case 2:
    bVar4 = ConsumeSignedInteger(this,&int_value,0x7fffffffffffffff);
    if (!bVar4) goto LAB_002f423b;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt64(reflection,message,field,int_value);
    }
    else {
      Reflection::SetInt64(reflection,message,field,int_value);
    }
    break;
  case 3:
    bVar4 = ConsumeUnsignedInteger(this,(uint64 *)&int_value,0xffffffff);
    if (!bVar4) goto LAB_002f423b;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt32(reflection,message,field,(uint32)int_value);
    }
    else {
      Reflection::SetUInt32(reflection,message,field,(uint32)int_value);
    }
    break;
  case 4:
    bVar4 = ConsumeUnsignedInteger(this,(uint64 *)&int_value,0xffffffffffffffff);
    if (!bVar4) goto LAB_002f423b;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt64(reflection,message,field,int_value);
    }
    else {
      Reflection::SetUInt64(reflection,message,field,int_value);
    }
    break;
  case 5:
    bVar4 = ConsumeDouble(this,(double *)&int_value);
    if (!bVar4) goto LAB_002f423b;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddDouble(reflection,message,field,(double)int_value);
    }
    else {
      Reflection::SetDouble(reflection,message,field,(double)int_value);
    }
    break;
  case 6:
    bVar4 = ConsumeDouble(this,(double *)&int_value);
    if (!bVar4) goto LAB_002f423b;
    iVar5 = *(int *)(field + 0x3c);
    value_02 = io::SafeDoubleToFloat((double)int_value);
    if (iVar5 == 3) {
      Reflection::AddFloat(reflection,message,field,value_02);
    }
    else {
      Reflection::SetFloat(reflection,message,field,value_02);
    }
    break;
  case 7:
    if ((this->tokenizer_).current_.type != TYPE_INTEGER) {
      value = 0;
      local_58[0]._M_allocated_capacity = (ulong)(uint7)local_58[0]._1_7_ << 8;
      int_value = (int64)local_58;
      bVar4 = ConsumeIdentifier(this,(string *)&int_value);
      if (bVar4) {
        iVar5 = std::__cxx11::string::compare((char *)&int_value);
        if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&int_value), iVar5 == 0)
            ) || (iVar5 = std::__cxx11::string::compare((char *)&int_value), iVar5 == 0)) {
          value_00 = true;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&int_value);
          if (((iVar5 != 0) &&
              (iVar5 = std::__cxx11::string::compare((char *)&int_value), iVar5 != 0)) &&
             (iVar5 = std::__cxx11::string::compare((char *)&int_value), iVar5 != 0)) {
            std::operator+(&local_100,"Invalid value for boolean field \"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            field);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
            psVar10 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_b0.field_2._M_allocated_capacity = *psVar10;
              local_b0.field_2._8_8_ = plVar8[3];
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar10;
              local_b0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_b0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::operator+(&local_d8,&local_b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &int_value);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
            pFVar11 = (FieldDescriptor *)(plVar8 + 2);
            if ((FieldDescriptor *)*plVar8 == pFVar11) {
              value_4._M_string_length = *(size_type *)pFVar11;
              value_4.field_2._M_allocated_capacity = plVar8[3];
              local_90 = (undefined1  [8])&value_4._M_string_length;
            }
            else {
              value_4._M_string_length = *(size_type *)pFVar11;
              local_90 = (undefined1  [8])*plVar8;
            }
            value_4._M_dataplus._M_p = (pointer)plVar8[1];
            *plVar8 = (long)pFVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_90);
            if (local_90 != (undefined1  [8])&value_4._M_string_length) {
              operator_delete((void *)local_90);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p);
            }
            goto LAB_002f4221;
          }
          value_00 = false;
        }
        if (*(int *)(field + 0x3c) == 3) {
          bVar4 = true;
          Reflection::AddBool(reflection,message,field,value_00);
        }
        else {
          bVar4 = true;
          Reflection::SetBool(reflection,message,field,value_00);
        }
      }
      else {
LAB_002f4221:
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)int_value != local_58) {
        operator_delete((void *)int_value);
      }
      goto joined_r0x002f3c63;
    }
    bVar4 = ConsumeUnsignedInteger(this,(uint64 *)&int_value,1);
    if (!bVar4) goto LAB_002f423b;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddBool(reflection,message,field,int_value != 0);
    }
    else {
      Reflection::SetBool(reflection,message,field,int_value != 0);
    }
    break;
  case 8:
    local_90 = (undefined1  [8])&value_4._M_string_length;
    value_4._M_dataplus._M_p = (pointer)0x0;
    value_4._M_string_length = value_4._M_string_length & 0xffffffffffffff00;
    value_4.field_2._8_8_ = 0x7fffffffffffffff;
    local_e0 = FieldDescriptor::enum_type(field);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar4 = ConsumeIdentifier(this,(string *)local_90);
      if (!bVar4) goto LAB_002f40f9;
      value_01 = EnumDescriptor::FindValueByName(local_e0,(string *)local_90);
LAB_002f3d3b:
      if (value_01 == (EnumValueDescriptor *)0x0) {
        if ((value_4.field_2._8_8_ == 0x7fffffffffffffff) ||
           (bVar4 = Reflection::SupportsUnknownEnumValues(reflection), !bVar4)) {
          if (this->allow_unknown_enum_ == false) {
            std::operator+(&local_100,"Unknown enumeration value of \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_90);
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
            psVar10 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_b0.field_2._M_allocated_capacity = *psVar10;
              local_b0.field_2._8_8_ = puVar7[3];
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar10;
              local_b0._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_b0._M_string_length = puVar7[1];
            *puVar7 = psVar10;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            std::operator+(&local_d8,&local_b0,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            field);
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
            psVar10 = puVar7 + 2;
            if ((size_type *)*puVar7 == psVar10) {
              local_58[0]._0_8_ = *psVar10;
              local_58[0]._8_8_ = puVar7[3];
              int_value = (int64)local_58;
            }
            else {
              local_58[0]._0_8_ = *psVar10;
              int_value = (int64)*puVar7;
            }
            value = puVar7[1];
            *puVar7 = psVar10;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)&int_value);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)int_value != local_58) {
              operator_delete((void *)int_value);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            paVar9 = &local_100.field_2;
            goto LAB_002f40ef;
          }
          std::operator+(&local_100,"Unknown enumeration value of \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90);
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
          psVar10 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_b0.field_2._M_allocated_capacity = *psVar10;
            local_b0.field_2._8_8_ = puVar7[3];
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = *psVar10;
            local_b0._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_b0._M_string_length = puVar7[1];
          *puVar7 = psVar10;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          std::operator+(&local_d8,&local_b0,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
          psVar10 = (size_type *)(plVar8 + 2);
          if ((size_type *)*plVar8 == psVar10) {
            local_58[0]._0_8_ = *psVar10;
            local_58[0]._8_8_ = plVar8[3];
            int_value = (int64)local_58;
          }
          else {
            local_58[0]._0_8_ = *psVar10;
            int_value = (int64)*plVar8;
          }
          value = plVar8[1];
          *plVar8 = (long)psVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)&int_value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)int_value != local_58) {
            operator_delete((void *)int_value);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p);
          }
          bVar4 = true;
          field = (FieldDescriptor *)0x1;
        }
        else {
          bVar4 = true;
          if (*(int *)(field + 0x3c) == 3) {
            Reflection::AddEnumValue(reflection,message,field,value_4.field_2._8_4_);
            field = (FieldDescriptor *)0x1;
          }
          else {
            Reflection::SetEnumValue(reflection,message,field,value_4.field_2._8_4_);
            field = (FieldDescriptor *)0x1;
          }
        }
      }
      else {
        if (*(int *)(field + 0x3c) == 3) {
          Reflection::AddEnum(reflection,message,field,value_01);
        }
        else {
          Reflection::SetEnum(reflection,message,field,value_01);
        }
        bVar4 = false;
      }
    }
    else {
      int_value = (int64)local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&int_value,"-","");
      iVar3 = int_value;
      __rhs = &(this->tokenizer_).current_.text;
      __n = (this->tokenizer_).current_.text._M_string_length;
      if ((__n == value) &&
         ((__n == 0 ||
          (local_b8 = __rhs, iVar5 = bcmp((__rhs->_M_dataplus)._M_p,(void *)int_value,__n),
          __rhs = local_b8, iVar5 == 0)))) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)iVar3 != local_58) {
          operator_delete((void *)iVar3);
        }
LAB_002f3ca4:
        bVar4 = ConsumeSignedInteger(this,(int64 *)(value_4.field_2._M_local_buf + 8),0x7fffffff);
        if (bVar4) {
          int_value = (int64)local_58;
          pcVar6 = FastInt64ToBufferLeft(value_4.field_2._8_8_,local_58[0]._M_local_buf);
          value = (long)pcVar6 - (long)local_58;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,int_value,value + int_value);
          std::__cxx11::string::operator=((string *)local_90,(string *)&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          value_01 = EnumDescriptor::FindValueByNumber(local_e0,value_4.field_2._8_4_);
          goto LAB_002f3d3b;
        }
      }
      else {
        TVar1 = (this->tokenizer_).current_.type;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)iVar3 != local_58) {
          local_b8 = __rhs;
          operator_delete((void *)iVar3);
          __rhs = local_b8;
        }
        if (TVar1 == TYPE_INTEGER) goto LAB_002f3ca4;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &int_value,"Expected integer or identifier, got: ",__rhs);
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)&int_value);
        paVar9 = local_58;
        local_100._M_dataplus._M_p = (pointer)int_value;
LAB_002f40ef:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar9) {
          operator_delete(local_100._M_dataplus._M_p);
        }
      }
LAB_002f40f9:
      bVar4 = true;
      field = (FieldDescriptor *)0x0;
    }
    bVar12 = (byte)field;
    if (local_90 != (undefined1  [8])&value_4._M_string_length) {
      operator_delete((void *)local_90);
    }
    if (bVar4) goto LAB_002f423d;
    break;
  case 9:
    value = 0;
    local_58[0]._M_allocated_capacity = (ulong)(uint7)local_58[0]._1_7_ << 8;
    int_value = (int64)local_58;
    bVar4 = ConsumeString(this,(string *)&int_value);
    if (bVar4) {
      if (*(int *)(field + 0x3c) == 3) {
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_140,int_value,value + int_value);
        Reflection::AddString(reflection,message,field,&local_140);
        psVar2 = &local_140;
        _Var13._M_p = local_140._M_dataplus._M_p;
      }
      else {
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_120,int_value,value + int_value);
        Reflection::SetString(reflection,message,field,&local_120);
        psVar2 = &local_120;
        _Var13._M_p = local_120._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &psVar2->field_2) {
        operator_delete(_Var13._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)int_value != local_58) {
      operator_delete((void *)int_value);
    }
joined_r0x002f3c63:
    if (!bVar4) goto LAB_002f423b;
    break;
  case 10:
    internal::LogMessage::LogMessage
              ((LogMessage *)&int_value,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/text_format.cc"
               ,0x32c);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&int_value,"Reached an unintended state: CPPTYPE_MESSAGE");
    internal::LogFinisher::operator=((LogFinisher *)local_90,other);
    internal::LogMessage::~LogMessage((LogMessage *)&int_value);
  }
  bVar12 = 1;
LAB_002f423d:
  return (bool)(bVar12 & 1);
}

Assistant:

bool ConsumeFieldValue(Message* message, const Reflection* reflection,
                         const FieldDescriptor* field) {
// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                    \
  if (field->is_repeated()) {                        \
    reflection->Add##CPPTYPE(message, field, VALUE); \
  } else {                                           \
    reflection->Set##CPPTYPE(message, field, VALUE); \
  }

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        std::string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          std::string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name() +
                        "\". Value: \"" + value + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        std::string value;
        int64 int_value = kint64max;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = nullptr;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = StrCat(int_value);  // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier, got: " +
                      tokenizer_.current().text);
          return false;
        }

        if (enum_value == nullptr) {
          if (int_value != kint64max &&
              reflection->SupportsUnknownEnumValues()) {
            SET_FIELD(EnumValue, int_value);
            return true;
          } else if (!allow_unknown_enum_) {
            ReportError("Unknown enumeration value of \"" + value +
                        "\" for "
                        "field \"" +
                        field->name() + "\".");
            return false;
          } else {
            ReportWarning("Unknown enumeration value of \"" + value +
                          "\" for "
                          "field \"" +
                          field->name() + "\".");
            return true;
          }
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }